

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O3

int run_test_pipe_set_non_blocking(void)

{
  int iVar1;
  int extraout_EAX;
  uv_barrier_t *barrier;
  ssize_t sVar2;
  int *piVar3;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  uv_barrier_t *unaff_R14;
  ulong uVar4;
  int fd [2];
  uv_thread_t thread;
  thread_ctx ctx;
  uv_buf_t buf;
  uv_pipe_t pipe_handle;
  char data [4096];
  undefined1 auStack_2180 [4104];
  uv_loop_t *puStack_1178;
  uv_barrier_t *puStack_1170;
  uv_file local_1168;
  uint local_1164;
  undefined1 local_1160 [40];
  uint local_1138;
  undefined1 local_1130 [16];
  uv_pipe_t local_1120;
  undefined1 local_1018 [4096];
  
  puStack_1170 = (uv_barrier_t *)0x163c99;
  barrier = (uv_barrier_t *)uv_default_loop();
  puStack_1170 = (uv_barrier_t *)0x163ca8;
  iVar1 = uv_pipe_init((uv_loop_t *)barrier,&local_1120,0);
  if (iVar1 == 0) {
    barrier = (uv_barrier_t *)0x1;
    puStack_1170 = (uv_barrier_t *)0x163cc4;
    iVar1 = socketpair(1,1,0,&local_1168);
    if (iVar1 != 0) goto LAB_00163e35;
    barrier = (uv_barrier_t *)&local_1120;
    puStack_1170 = (uv_barrier_t *)0x163cd9;
    iVar1 = uv_pipe_open((uv_pipe_t *)barrier,local_1168);
    if (iVar1 != 0) goto LAB_00163e3a;
    barrier = (uv_barrier_t *)&local_1120;
    puStack_1170 = (uv_barrier_t *)0x163cf0;
    iVar1 = uv_stream_set_blocking((uv_stream_t *)barrier,1);
    if (iVar1 != 0) goto LAB_00163e3f;
    barrier = (uv_barrier_t *)(local_1160 + 8);
    local_1138 = local_1164;
    puStack_1170 = (uv_barrier_t *)0x163d0e;
    iVar1 = uv_barrier_init(barrier,2);
    if (iVar1 != 0) goto LAB_00163e44;
    barrier = (uv_barrier_t *)local_1160;
    puStack_1170 = (uv_barrier_t *)0x163d2c;
    iVar1 = uv_thread_create((uv_thread_t *)&barrier->__align,thread_main,local_1160 + 8);
    if (iVar1 != 0) goto LAB_00163e49;
    puStack_1170 = (uv_barrier_t *)0x163d3e;
    uv_barrier_wait((uv_barrier_t *)(local_1160 + 8));
    unaff_RBX = (uv_loop_t *)local_1130;
    local_1130._8_8_ = 0x1000;
    local_1130._0_8_ = local_1018;
    puStack_1170 = (uv_barrier_t *)0x163d65;
    memset((void *)local_1130._0_8_,0x2e,0x1000);
    uVar4 = 0xfffffffffffff000;
    unaff_R14 = (uv_barrier_t *)&local_1120;
    do {
      puStack_1170 = (uv_barrier_t *)0x163d81;
      barrier = unaff_R14;
      iVar1 = uv_try_write((uv_stream_t *)unaff_R14,(uv_buf_t *)unaff_RBX,1);
      if (iVar1 != 0x1000) {
        puStack_1170 = (uv_barrier_t *)0x163e30;
        run_test_pipe_set_non_blocking_cold_7();
        goto LAB_00163e30;
      }
      uVar4 = uVar4 + 0x1000;
    } while (uVar4 < 0x9ff000);
    puStack_1170 = (uv_barrier_t *)0x163da8;
    uv_close((uv_handle_t *)&local_1120,(uv_close_cb)0x0);
    puStack_1170 = (uv_barrier_t *)0x163dad;
    barrier = (uv_barrier_t *)uv_default_loop();
    puStack_1170 = (uv_barrier_t *)0x163db7;
    iVar1 = uv_run((uv_loop_t *)barrier,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00163e4e;
    barrier = (uv_barrier_t *)local_1160;
    puStack_1170 = (uv_barrier_t *)0x163dc9;
    iVar1 = uv_thread_join((uv_thread_t *)&barrier->__align);
    if (iVar1 != 0) goto LAB_00163e53;
    barrier = (uv_barrier_t *)(ulong)local_1164;
    puStack_1170 = (uv_barrier_t *)0x163dda;
    iVar1 = close(local_1164);
    if (iVar1 == 0) {
      puStack_1170 = (uv_barrier_t *)0x163de8;
      uv_barrier_destroy((uv_barrier_t *)(local_1160 + 8));
      puStack_1170 = (uv_barrier_t *)0x163ded;
      unaff_RBX = uv_default_loop();
      puStack_1170 = (uv_barrier_t *)0x163e01;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_1170 = (uv_barrier_t *)0x163e0b;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      puStack_1170 = (uv_barrier_t *)0x163e10;
      barrier = (uv_barrier_t *)uv_default_loop();
      puStack_1170 = (uv_barrier_t *)0x163e18;
      iVar1 = uv_loop_close((uv_loop_t *)barrier);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163e5d;
    }
  }
  else {
LAB_00163e30:
    puStack_1170 = (uv_barrier_t *)0x163e35;
    run_test_pipe_set_non_blocking_cold_1();
LAB_00163e35:
    puStack_1170 = (uv_barrier_t *)0x163e3a;
    run_test_pipe_set_non_blocking_cold_2();
LAB_00163e3a:
    puStack_1170 = (uv_barrier_t *)0x163e3f;
    run_test_pipe_set_non_blocking_cold_3();
LAB_00163e3f:
    puStack_1170 = (uv_barrier_t *)0x163e44;
    run_test_pipe_set_non_blocking_cold_4();
LAB_00163e44:
    puStack_1170 = (uv_barrier_t *)0x163e49;
    run_test_pipe_set_non_blocking_cold_5();
LAB_00163e49:
    puStack_1170 = (uv_barrier_t *)0x163e4e;
    run_test_pipe_set_non_blocking_cold_6();
LAB_00163e4e:
    puStack_1170 = (uv_barrier_t *)0x163e53;
    run_test_pipe_set_non_blocking_cold_8();
LAB_00163e53:
    puStack_1170 = (uv_barrier_t *)0x163e58;
    run_test_pipe_set_non_blocking_cold_9();
  }
  puStack_1170 = (uv_barrier_t *)0x163e5d;
  run_test_pipe_set_non_blocking_cold_10();
LAB_00163e5d:
  puStack_1170 = (uv_barrier_t *)thread_main;
  run_test_pipe_set_non_blocking_cold_11();
  puStack_1178 = unaff_RBX;
  puStack_1170 = unaff_R14;
  uv_barrier_wait(barrier);
  while( true ) {
    do {
      handle = (uv_handle_t *)(ulong)*(uint *)(barrier + 1);
      sVar2 = read(*(uint *)(barrier + 1),auStack_2180,0x1000);
    } while (0 < sVar2);
    if (sVar2 != -1) break;
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
LAB_00163eae:
      thread_main_cold_1();
      iVar1 = uv_is_closing(handle);
      if (iVar1 == 0) {
        uv_close(handle,(uv_close_cb)0x0);
        return extraout_EAX;
      }
      return iVar1;
    }
  }
  if (sVar2 == 0) {
    return 0;
  }
  goto LAB_00163eae;
}

Assistant:

TEST_IMPL(pipe_set_non_blocking) {
  struct thread_ctx ctx;
  uv_pipe_t pipe_handle;
  uv_thread_t thread;
  size_t nwritten;
  char data[4096];
  uv_buf_t buf;
  int fd[2];
  int n;

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, fd));
  ASSERT(0 == uv_pipe_open(&pipe_handle, fd[0]));
  ASSERT(0 == uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1));

  ctx.fd = fd[1];
  ASSERT(0 == uv_barrier_init(&ctx.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));
  uv_barrier_wait(&ctx.barrier);

  buf.len = sizeof(data);
  buf.base = data;
  memset(data, '.', sizeof(data));

  nwritten = 0;
  while (nwritten < 10 << 20) {
    /* The stream is in blocking mode so uv_try_write() should always succeed
     * with the exact number of bytes that we wanted written.
     */
    n = uv_try_write((uv_stream_t*) &pipe_handle, &buf, 1);
    ASSERT(n == sizeof(data));
    nwritten += n;
  }

  uv_close((uv_handle_t*) &pipe_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == close(fd[1]));  /* fd[0] is closed by uv_close(). */
  uv_barrier_destroy(&ctx.barrier);

  MAKE_VALGRIND_HAPPY();
  return 0;
}